

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ostream * lexer::operator<<(ostream *os,Token *token)

{
  _Rb_tree_node_base *p_Var1;
  ostream *poVar2;
  int maxTerminalNameLength;
  
  maxTerminalNameLength = 0;
  for (p_Var1 = (_Rb_tree_node_base *)json::rules::terminalsNames_abi_cxx11_._24_8_;
      p_Var1 != (_Rb_tree_node_base *)(json::rules::terminalsNames_abi_cxx11_ + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (maxTerminalNameLength <= *(int *)&p_Var1[1]._M_left) {
      maxTerminalNameLength = *(int *)&p_Var1[1]._M_left;
    }
  }
  poVar2 = Token::stringify(token,os,(TerminalNames *)json::rules::terminalsNames_abi_cxx11_,
                            maxTerminalNameLength);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, lexer::Token const& token) {
        int maxNameLength = 0;
        for_each_c(lexer::TerminalNames, json::rules::terminalsNames, terminalName)
            maxNameLength = std::max<int>(maxNameLength, terminalName->second.size());
        return token.stringify(os, json::rules::terminalsNames, maxNameLength);
    }